

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void __thiscall
sf2cute::SoundFont::RemoveSampleIf
          (SoundFont *this,function<bool_(const_std::shared_ptr<sf2cute::SFSample>_&)> *predicate)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar4;
  SFSample *__tmp;
  long lVar5;
  pointer psVar6;
  iterator iVar7;
  long lVar8;
  pointer psVar9;
  pointer psVar10;
  
  psVar6 = (this->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)psVar1 - (long)psVar6;
  iVar7._M_current = psVar1;
  if (0 < lVar8 >> 6) {
    lVar5 = (lVar8 >> 6) + 1;
    psVar9 = psVar6;
    do {
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010722a;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar9);
      psVar6 = psVar9;
      if (cVar4 != '\0') goto LAB_0010719b;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010722a;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar9 + 1);
      psVar6 = psVar9 + 1;
      if (cVar4 != '\0') goto LAB_0010719b;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010722a;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar9 + 2);
      psVar6 = psVar9 + 2;
      if (cVar4 != '\0') goto LAB_0010719b;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010722a;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar9 + 3);
      psVar6 = psVar9 + 3;
      if (cVar4 != '\0') goto LAB_0010719b;
      psVar6 = psVar9 + 4;
      lVar5 = lVar5 + -1;
      lVar8 = lVar8 + -0x40;
      psVar9 = psVar6;
    } while (1 < lVar5);
  }
  lVar8 = lVar8 >> 4;
  if (lVar8 == 1) {
LAB_0010717f:
    if (*(long *)(predicate + 0x10) == 0) {
LAB_0010722a:
      std::__throw_bad_function_call();
    }
    cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar6);
    if (cVar4 == '\0') goto LAB_00107208;
  }
  else if (lVar8 == 2) {
LAB_0010715d:
    if (*(long *)(predicate + 0x10) == 0) goto LAB_0010722a;
    cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar6);
    if (cVar4 == '\0') {
      psVar6 = psVar6 + 1;
      goto LAB_0010717f;
    }
  }
  else {
    if (lVar8 != 3) goto LAB_00107208;
    if (*(long *)(predicate + 0x10) == 0) goto LAB_0010722a;
    cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar6);
    if (cVar4 == '\0') {
      psVar6 = psVar6 + 1;
      goto LAB_0010715d;
    }
  }
LAB_0010719b:
  ((psVar6->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->parent_file_
       = (SoundFont *)0x0;
  psVar9 = psVar6;
  if (psVar6 != psVar1) {
    while (psVar10 = psVar9 + 1, iVar7._M_current = psVar6, psVar10 != psVar1) {
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010722a;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar10);
      peVar2 = (psVar10->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (cVar4 == '\0') {
        p_Var3 = psVar9[1].super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (psVar10->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        psVar9[1].super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (psVar6->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2;
        this_00 = (psVar6->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        (psVar6->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
        _M_pi = p_Var3;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        psVar6 = psVar6 + 1;
        psVar9 = psVar10;
      }
      else {
        peVar2->parent_file_ = (SoundFont *)0x0;
        psVar9 = psVar10;
      }
    }
  }
LAB_00107208:
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  _M_erase(&this->samples_,iVar7,
           (this->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void SoundFont::RemoveSampleIf(
    std::function<bool(const std::shared_ptr<SFSample> &)> predicate) {
  samples_.erase(std::remove_if(samples_.begin(), samples_.end(),
    [&predicate](const std::shared_ptr<SFSample> & sample) -> bool {
      if (predicate(sample)) {
        sample->reset_parent_file();
        return true;
      }
      else {
        return false;
      }
    }), samples_.end());
}